

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Options *options_;
  Driver d;
  allocator<char> local_711;
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
  local_710;
  string local_6f8;
  Parse local_6d8;
  Driver local_580;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Verona",&local_711);
  options_ = verona::options();
  verona::parser();
  verona::passes();
  trieste::Driver::Driver(&local_580,&local_6f8,&options_->super_Options,&local_6d8,&local_710);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  ~vector(&local_710);
  trieste::Parse::~Parse(&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  iVar1 = trieste::Driver::run(&local_580,argc,argv);
  trieste::Driver::~Driver(&local_580);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  trieste::Driver d(
    "Verona", &verona::options(), verona::parser(), verona::passes());

  return d.run(argc, argv);
}